

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sim.cc
# Opt level: O2

void __thiscall kratos::Simulator::Simulator(Simulator *this,Generator *generator)

{
  undefined1 local_f0 [8];
  DependencyVisitor visitor;
  
  (this->values_)._M_h._M_buckets = &(this->values_)._M_h._M_single_bucket;
  (this->values_)._M_h._M_bucket_count = 1;
  (this->values_)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->values_)._M_h._M_element_count = 0;
  (this->values_)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (this->values_)._M_h._M_rehash_policy._M_next_resize = 0;
  (this->values_)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  (this->complex_values_)._M_h._M_buckets = &(this->complex_values_)._M_h._M_single_bucket;
  (this->complex_values_)._M_h._M_bucket_count = 1;
  (this->complex_values_)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->complex_values_)._M_h._M_element_count = 0;
  (this->complex_values_)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (this->complex_values_)._M_h._M_rehash_policy._M_next_resize = 0;
  (this->complex_values_)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  std::
  queue<std::pair<kratos::Var_const*,kratos::Stmt*>,std::deque<std::pair<kratos::Var_const*,kratos::Stmt*>,std::allocator<std::pair<kratos::Var_const*,kratos::Stmt*>>>>
  ::
  queue<std::deque<std::pair<kratos::Var_const*,kratos::Stmt*>,std::allocator<std::pair<kratos::Var_const*,kratos::Stmt*>>>,void>
            (&this->event_queue_);
  (this->dependency_)._M_h._M_buckets = &(this->dependency_)._M_h._M_single_bucket;
  (this->dependency_)._M_h._M_bucket_count = 1;
  (this->dependency_)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->dependency_)._M_h._M_element_count = 0;
  (this->dependency_)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (this->dependency_)._M_h._M_rehash_policy._M_next_resize = 0;
  (this->dependency_)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  (this->linked_dependency_)._M_h._M_buckets = &(this->linked_dependency_)._M_h._M_single_bucket;
  (this->linked_dependency_)._M_h._M_bucket_count = 1;
  (this->linked_dependency_)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->linked_dependency_)._M_h._M_element_count = 0;
  (this->linked_dependency_)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (this->linked_dependency_)._M_h._M_rehash_policy._M_next_resize = 0;
  (this->linked_dependency_)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  (this->scope_)._M_h._M_buckets = &(this->scope_)._M_h._M_single_bucket;
  (this->scope_)._M_h._M_bucket_count = 1;
  (this->scope_)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->scope_)._M_h._M_element_count = 0;
  (this->scope_)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (this->scope_)._M_h._M_rehash_policy._M_next_resize = 0;
  (this->scope_)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  (this->nba_values_)._M_h._M_buckets = &(this->nba_values_)._M_h._M_single_bucket;
  (this->nba_values_)._M_h._M_bucket_count = 1;
  (this->nba_values_)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->nba_values_)._M_h._M_element_count = 0;
  (this->nba_values_)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  this->simulation_depth_ = 0;
  (this->nba_values_)._M_h._M_rehash_policy._M_next_resize = 0;
  (this->nba_values_)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  if (generator != (Generator *)0x0) {
    visitor.linked_dependency_._M_h._M_single_bucket = (__node_base_ptr)&this->dependency_;
    fix_assignment_type(generator);
    visitor.super_IRVisitor._8_8_ =
         &visitor.super_IRVisitor.visited_._M_h._M_rehash_policy._M_next_resize;
    visitor.super_IRVisitor._vptr_IRVisitor._0_4_ = 0;
    visitor.super_IRVisitor.visited_._M_h._M_buckets = (__buckets_ptr)0x1;
    visitor.super_IRVisitor.visited_._M_h._M_bucket_count = 0;
    visitor.super_IRVisitor.visited_._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
    visitor.super_IRVisitor.visited_._M_h._M_element_count._0_4_ = 0x3f800000;
    visitor.super_IRVisitor.visited_._M_h._M_rehash_policy._M_max_load_factor = 0.0;
    visitor.super_IRVisitor.visited_._M_h._M_rehash_policy._4_4_ = 0;
    visitor.super_IRVisitor.visited_._M_h._M_rehash_policy._M_next_resize = 0;
    local_f0 = (undefined1  [8])&PTR_visit_root_002a9218;
    visitor.super_IRVisitor.visited_._M_h._M_single_bucket =
         (__node_base_ptr)&visitor.dependency_._M_h._M_rehash_policy._M_next_resize;
    visitor.dependency_._M_h._M_buckets = (__buckets_ptr)0x1;
    visitor.dependency_._M_h._M_bucket_count = 0;
    visitor.dependency_._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
    visitor.dependency_._M_h._M_element_count._0_4_ = 0x3f800000;
    visitor.dependency_._M_h._M_rehash_policy._M_max_load_factor = 0.0;
    visitor.dependency_._M_h._M_rehash_policy._4_4_ = 0;
    visitor.dependency_._M_h._M_rehash_policy._M_next_resize = 0;
    visitor.dependency_._M_h._M_single_bucket =
         (__node_base_ptr)&visitor.linked_dependency_._M_h._M_rehash_policy._M_next_resize;
    visitor.linked_dependency_._M_h._M_buckets = (__buckets_ptr)0x1;
    visitor.linked_dependency_._M_h._M_bucket_count = 0;
    visitor.linked_dependency_._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
    visitor.linked_dependency_._M_h._M_element_count._0_4_ = 0x3f800000;
    visitor.linked_dependency_._M_h._M_rehash_policy._M_max_load_factor = 0.0;
    visitor.linked_dependency_._M_h._M_rehash_policy._4_4_ = 0;
    visitor.linked_dependency_._M_h._M_rehash_policy._M_next_resize = 0;
    IRVisitor::visit_generator_root_p((IRVisitor *)local_f0,generator);
    std::
    _Hashtable<const_kratos::Var_*,_std::pair<const_kratos::Var_*const,_std::unordered_set<kratos::Stmt_*,_std::hash<kratos::Stmt_*>,_std::equal_to<kratos::Stmt_*>,_std::allocator<kratos::Stmt_*>_>_>,_std::allocator<std::pair<const_kratos::Var_*const,_std::unordered_set<kratos::Stmt_*,_std::hash<kratos::Stmt_*>,_std::equal_to<kratos::Stmt_*>,_std::allocator<kratos::Stmt_*>_>_>_>,_std::__detail::_Select1st,_std::equal_to<const_kratos::Var_*>,_std::hash<const_kratos::Var_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
    ::operator=((_Hashtable<const_kratos::Var_*,_std::pair<const_kratos::Var_*const,_std::unordered_set<kratos::Stmt_*,_std::hash<kratos::Stmt_*>,_std::equal_to<kratos::Stmt_*>,_std::allocator<kratos::Stmt_*>_>_>,_std::allocator<std::pair<const_kratos::Var_*const,_std::unordered_set<kratos::Stmt_*,_std::hash<kratos::Stmt_*>,_std::equal_to<kratos::Stmt_*>,_std::allocator<kratos::Stmt_*>_>_>_>,_std::__detail::_Select1st,_std::equal_to<const_kratos::Var_*>,_std::hash<const_kratos::Var_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                 *)visitor.linked_dependency_._M_h._M_single_bucket,
                (_Hashtable<const_kratos::Var_*,_std::pair<const_kratos::Var_*const,_std::unordered_set<kratos::Stmt_*,_std::hash<kratos::Stmt_*>,_std::equal_to<kratos::Stmt_*>,_std::allocator<kratos::Stmt_*>_>_>,_std::allocator<std::pair<const_kratos::Var_*const,_std::unordered_set<kratos::Stmt_*,_std::hash<kratos::Stmt_*>,_std::equal_to<kratos::Stmt_*>,_std::allocator<kratos::Stmt_*>_>_>_>,_std::__detail::_Select1st,_std::equal_to<const_kratos::Var_*>,_std::hash<const_kratos::Var_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                 *)&visitor.super_IRVisitor.visited_._M_h._M_single_bucket);
    std::
    _Hashtable<const_kratos::Var_*,_std::pair<const_kratos::Var_*const,_std::unordered_map<unsigned_int,_kratos::Var_*,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_kratos::Var_*>_>_>_>,_std::allocator<std::pair<const_kratos::Var_*const,_std::unordered_map<unsigned_int,_kratos::Var_*,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_kratos::Var_*>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<const_kratos::Var_*>,_std::hash<const_kratos::Var_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
    ::operator=(&(this->linked_dependency_)._M_h,
                (_Hashtable<const_kratos::Var_*,_std::pair<const_kratos::Var_*const,_std::unordered_map<unsigned_int,_kratos::Var_*,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_kratos::Var_*>_>_>_>,_std::allocator<std::pair<const_kratos::Var_*const,_std::unordered_map<unsigned_int,_kratos::Var_*,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_kratos::Var_*>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<const_kratos::Var_*>,_std::hash<const_kratos::Var_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                 *)&visitor.dependency_._M_h._M_single_bucket);
    init_pull_up_value(this,generator);
    DependencyVisitor::~DependencyVisitor((DependencyVisitor *)local_f0);
  }
  return;
}

Assistant:

Simulator::Simulator(kratos::Generator *generator) {
    if (!generator) return;
    // fix the assignment type
    fix_assignment_type(generator);
    // compute the dependency
    DependencyVisitor visitor;
    // visit in parallel to build up and dep table
    visitor.visit_generator_root_p(generator);
    dependency_ = visitor.dependency();
    linked_dependency_ = visitor.linked_dependency();
    init_pull_up_value(generator);
}